

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx::ConeCurveMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar26;
  ulong uVar27;
  Scene *pSVar28;
  long lVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  float fVar40;
  float fVar41;
  undefined1 auVar33 [16];
  float fVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar83;
  float fVar84;
  undefined1 auVar81 [16];
  float fVar85;
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  float fVar113;
  float fVar114;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  float fVar124;
  float fVar125;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar126 [16];
  float fVar132;
  undefined1 auVar127 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar136 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  Primitive *local_278;
  Scene *local_270;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  RTCHitN local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  pSVar28 = context->scene;
  uVar26 = (line->v0).field_0.i[0];
  pGVar6 = (pSVar28->geometries).items[line->sharedGeomID].ptr;
  lVar29 = *(long *)&pGVar6[1].time_range.upper;
  p_Var7 = pGVar6[1].intersectionFilterN;
  auVar39 = *(undefined1 (*) [16])(lVar29 + (ulong)uVar26 * (long)p_Var7);
  uVar3 = (line->v0).field_0.i[1];
  auVar36 = *(undefined1 (*) [16])(lVar29 + (ulong)uVar3 * (long)p_Var7);
  uVar4 = (line->v0).field_0.i[2];
  auVar45 = *(undefined1 (*) [16])(lVar29 + (ulong)uVar4 * (long)p_Var7);
  uVar5 = (line->v0).field_0.i[3];
  auVar46 = *(undefined1 (*) [16])(lVar29 + (ulong)uVar5 * (long)p_Var7);
  auVar95 = vunpcklps_avx(auVar39,auVar45);
  auVar39 = vunpckhps_avx(auVar39,auVar45);
  auVar45 = vunpcklps_avx(auVar36,auVar46);
  auVar36 = vunpckhps_avx(auVar36,auVar46);
  auVar92 = vunpcklps_avx(auVar95,auVar45);
  auVar55 = vunpckhps_avx(auVar95,auVar45);
  auVar93 = vunpcklps_avx(auVar39,auVar36);
  auVar56 = vunpckhps_avx(auVar39,auVar36);
  auVar39 = *(undefined1 (*) [16])(lVar29 + (ulong)(uVar26 + 1) * (long)p_Var7);
  auVar36 = *(undefined1 (*) [16])(lVar29 + (ulong)(uVar3 + 1) * (long)p_Var7);
  auVar45 = *(undefined1 (*) [16])(lVar29 + (ulong)(uVar4 + 1) * (long)p_Var7);
  auVar46 = *(undefined1 (*) [16])(lVar29 + (ulong)(uVar5 + 1) * (long)p_Var7);
  auVar95 = vpunpckldq_avx(auVar39,auVar45);
  auVar39 = vpunpckhdq_avx(auVar39,auVar45);
  auVar45 = vpunpckldq_avx(auVar36,auVar46);
  auVar36 = vpunpckhdq_avx(auVar36,auVar46);
  auVar37 = vpunpckldq_avx(auVar95,auVar45);
  auVar45 = vpunpckhdq_avx(auVar95,auVar45);
  auVar95 = vpunpckldq_avx(auVar39,auVar36);
  auVar46 = vpunpckhdq_avx(auVar39,auVar36);
  auVar39 = vpcmpeqd_avx(auVar46,auVar46);
  auVar36 = vpcmpeqd_avx(auVar39,(undefined1  [16])(line->primIDs).field_0);
  local_148 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  fVar135 = *(float *)(ray + k * 4 + 0x40);
  fVar140 = *(float *)(ray + k * 4 + 0x50);
  fVar125 = *(float *)(ray + k * 4 + 0x60);
  auVar39 = ZEXT416((uint)(fVar135 * fVar135 + fVar140 * fVar140 + fVar125 * fVar125));
  auVar54 = vshufps_avx(auVar39,auVar39,0);
  auVar39 = vrcpps_avx(auVar54);
  fVar43 = auVar39._0_4_;
  auVar33._0_4_ = fVar43 * auVar54._0_4_;
  fVar49 = auVar39._4_4_;
  auVar33._4_4_ = fVar49 * auVar54._4_4_;
  fVar50 = auVar39._8_4_;
  auVar33._8_4_ = fVar50 * auVar54._8_4_;
  fVar51 = auVar39._12_4_;
  auVar33._12_4_ = fVar51 * auVar54._12_4_;
  auVar39._8_4_ = 0x3f800000;
  auVar39._0_8_ = &DAT_3f8000003f800000;
  auVar39._12_4_ = 0x3f800000;
  auVar39 = vsubps_avx(auVar39,auVar33);
  auVar44._0_4_ = (auVar37._0_4_ + auVar92._0_4_) * 0.5;
  auVar44._4_4_ = (auVar37._4_4_ + auVar92._4_4_) * 0.5;
  auVar44._8_4_ = (auVar37._8_4_ + auVar92._8_4_) * 0.5;
  auVar44._12_4_ = (auVar37._12_4_ + auVar92._12_4_) * 0.5;
  auVar63._0_4_ = (auVar45._0_4_ + auVar55._0_4_) * 0.5;
  auVar63._4_4_ = (auVar45._4_4_ + auVar55._4_4_) * 0.5;
  auVar63._8_4_ = (auVar45._8_4_ + auVar55._8_4_) * 0.5;
  auVar63._12_4_ = (auVar45._12_4_ + auVar55._12_4_) * 0.5;
  auVar52._0_4_ = (auVar93._0_4_ + auVar95._0_4_) * 0.5;
  auVar52._4_4_ = (auVar93._4_4_ + auVar95._4_4_) * 0.5;
  auVar52._8_4_ = (auVar93._8_4_ + auVar95._8_4_) * 0.5;
  auVar52._12_4_ = (auVar93._12_4_ + auVar95._12_4_) * 0.5;
  fVar129 = *(float *)(ray + k * 4 + 0x10);
  auVar81._4_4_ = fVar129;
  auVar81._0_4_ = fVar129;
  auVar81._8_4_ = fVar129;
  auVar81._12_4_ = fVar129;
  auVar54 = vsubps_avx(auVar63,auVar81);
  fVar131 = *(float *)(ray + k * 4 + 0x20);
  auVar91._4_4_ = fVar131;
  auVar91._0_4_ = fVar131;
  auVar91._8_4_ = fVar131;
  auVar91._12_4_ = fVar131;
  auVar33 = vsubps_avx(auVar52,auVar91);
  fVar133 = *(float *)(ray + k * 4);
  auVar64._4_4_ = fVar133;
  auVar64._0_4_ = fVar133;
  auVar64._8_4_ = fVar133;
  auVar64._12_4_ = fVar133;
  auVar44 = vsubps_avx(auVar44,auVar64);
  local_238 = (fVar135 * auVar44._0_4_ + fVar140 * auVar54._0_4_ + fVar125 * auVar33._0_4_) *
              (fVar43 + fVar43 * auVar39._0_4_);
  fStack_234 = (fVar135 * auVar44._4_4_ + fVar140 * auVar54._4_4_ + fVar125 * auVar33._4_4_) *
               (fVar49 + fVar49 * auVar39._4_4_);
  fStack_230 = (fVar135 * auVar44._8_4_ + fVar140 * auVar54._8_4_ + fVar125 * auVar33._8_4_) *
               (fVar50 + fVar50 * auVar39._8_4_);
  fStack_22c = (fVar135 * auVar44._12_4_ + fVar140 * auVar54._12_4_ + fVar125 * auVar33._12_4_) *
               (fVar51 + fVar51 * auVar39._12_4_);
  auVar65._0_4_ = fVar133 + fVar135 * local_238;
  auVar65._4_4_ = fVar133 + fVar135 * fStack_234;
  auVar65._8_4_ = fVar133 + fVar135 * fStack_230;
  auVar65._12_4_ = fVar133 + fVar135 * fStack_22c;
  auVar152._0_4_ = fVar129 + fVar140 * local_238;
  auVar152._4_4_ = fVar129 + fVar140 * fStack_234;
  auVar152._8_4_ = fVar129 + fVar140 * fStack_230;
  auVar152._12_4_ = fVar129 + fVar140 * fStack_22c;
  auVar53._0_4_ = fVar131 + fVar125 * local_238;
  auVar53._4_4_ = fVar131 + fVar125 * fStack_234;
  auVar53._8_4_ = fVar131 + fVar125 * fStack_230;
  auVar53._12_4_ = fVar131 + fVar125 * fStack_22c;
  local_1f8 = vsubps_avx(auVar45,auVar55);
  local_208 = vsubps_avx(auVar95,auVar93);
  fVar129 = local_208._0_4_;
  fVar50 = local_208._4_4_;
  fVar143 = local_208._8_4_;
  fVar12 = local_208._12_4_;
  fVar131 = local_1f8._0_4_;
  fVar51 = local_1f8._4_4_;
  fVar9 = local_1f8._8_4_;
  fVar13 = local_1f8._12_4_;
  local_1e8 = vsubps_avx(auVar37,auVar92);
  fVar133 = local_1e8._0_4_;
  fVar141 = local_1e8._4_4_;
  fVar10 = local_1e8._8_4_;
  fVar14 = local_1e8._12_4_;
  fVar32 = fVar133 * fVar133 + fVar131 * fVar131 + fVar129 * fVar129;
  fVar40 = fVar141 * fVar141 + fVar51 * fVar51 + fVar50 * fVar50;
  fVar41 = fVar10 * fVar10 + fVar9 * fVar9 + fVar143 * fVar143;
  fVar42 = fVar14 * fVar14 + fVar13 * fVar13 + fVar12 * fVar12;
  local_288 = vsubps_avx(auVar152,auVar55);
  _local_218 = vsubps_avx(auVar53,auVar93);
  fVar43 = local_218._0_4_;
  fVar144 = local_218._4_4_;
  fVar145 = local_218._8_4_;
  fVar146 = local_218._12_4_;
  fVar147 = local_288._0_4_;
  fVar149 = local_288._4_4_;
  fVar150 = local_288._8_4_;
  fVar151 = local_288._12_4_;
  _local_298 = vsubps_avx(auVar65,auVar92);
  fVar113 = local_298._0_4_;
  fVar118 = local_298._4_4_;
  fVar120 = local_298._8_4_;
  fVar122 = local_298._12_4_;
  fVar80 = fVar113 * fVar133 + fVar147 * fVar131 + fVar129 * fVar43;
  fVar83 = fVar118 * fVar141 + fVar149 * fVar51 + fVar50 * fVar144;
  fVar84 = fVar120 * fVar10 + fVar150 * fVar9 + fVar143 * fVar145;
  fVar85 = fVar122 * fVar14 + fVar151 * fVar13 + fVar12 * fVar146;
  auVar136._0_4_ = fVar135 * fVar133 + fVar140 * fVar131 + fVar129 * fVar125;
  auVar136._4_4_ = fVar135 * fVar141 + fVar140 * fVar51 + fVar50 * fVar125;
  auVar136._8_4_ = fVar135 * fVar10 + fVar140 * fVar9 + fVar143 * fVar125;
  auVar136._12_4_ = fVar135 * fVar14 + fVar140 * fVar13 + fVar12 * fVar125;
  auVar39 = vsubps_avx(auVar56,auVar46);
  fVar49 = auVar39._0_4_;
  fVar142 = auVar39._4_4_;
  fVar11 = auVar39._8_4_;
  fVar15 = auVar39._12_4_;
  local_1c8 = fVar49 * fVar49 + fVar32;
  fStack_1c4 = fVar142 * fVar142 + fVar40;
  fStack_1c0 = fVar11 * fVar11 + fVar41;
  fStack_1bc = fVar15 * fVar15 + fVar42;
  local_158._0_4_ = fVar32 * fVar32;
  local_158._4_4_ = fVar40 * fVar40;
  fStack_150 = fVar41 * fVar41;
  fStack_14c = fVar42 * fVar42;
  auVar54._0_4_ =
       (float)local_158._0_4_ * (fVar135 * fVar113 + fVar140 * fVar147 + fVar125 * fVar43);
  auVar54._4_4_ =
       (float)local_158._4_4_ * (fVar135 * fVar118 + fVar140 * fVar149 + fVar125 * fVar144);
  auVar54._8_4_ = fStack_150 * (fVar135 * fVar120 + fVar140 * fVar150 + fVar125 * fVar145);
  auVar54._12_4_ = fStack_14c * (fVar135 * fVar122 + fVar140 * fVar151 + fVar125 * fVar146);
  auVar109._0_4_ = auVar136._0_4_ * fVar80 * local_1c8;
  auVar109._4_4_ = auVar136._4_4_ * fVar83 * fStack_1c4;
  auVar109._8_4_ = auVar136._8_4_ * fVar84 * fStack_1c0;
  auVar109._12_4_ = auVar136._12_4_ * fVar85 * fStack_1bc;
  auVar39 = vsubps_avx(auVar54,auVar109);
  fVar134 = auVar56._0_4_;
  auVar110._0_4_ = fVar134 * fVar32;
  fVar137 = auVar56._4_4_;
  auVar110._4_4_ = fVar137 * fVar40;
  fVar138 = auVar56._8_4_;
  auVar110._8_4_ = fVar138 * fVar41;
  fVar139 = auVar56._12_4_;
  auVar110._12_4_ = fVar139 * fVar42;
  auVar148._0_4_ = auVar110._0_4_ * auVar136._0_4_ * fVar49 + auVar39._0_4_;
  auVar148._4_4_ = auVar110._4_4_ * auVar136._4_4_ * fVar142 + auVar39._4_4_;
  auVar148._8_4_ = auVar110._8_4_ * auVar136._8_4_ * fVar11 + auVar39._8_4_;
  auVar148._12_4_ = auVar110._12_4_ * auVar136._12_4_ * fVar15 + auVar39._12_4_;
  auVar55._0_4_ = (float)local_158._0_4_ * (fVar113 * fVar113 + fVar147 * fVar147 + fVar43 * fVar43)
  ;
  auVar55._4_4_ =
       (float)local_158._4_4_ * (fVar118 * fVar118 + fVar149 * fVar149 + fVar144 * fVar144);
  auVar55._8_4_ = fStack_150 * (fVar120 * fVar120 + fVar150 * fVar150 + fVar145 * fVar145);
  auVar55._12_4_ = fStack_14c * (fVar122 * fVar122 + fVar151 * fVar151 + fVar146 * fVar146);
  auVar92._0_4_ = local_1c8 * fVar80 * fVar80;
  auVar92._4_4_ = fStack_1c4 * fVar83 * fVar83;
  auVar92._8_4_ = fStack_1c0 * fVar84 * fVar84;
  auVar92._12_4_ = fStack_1bc * fVar85 * fVar85;
  auVar39 = vsubps_avx(auVar55,auVar92);
  auVar93._0_4_ = (fVar49 + fVar49) * fVar80;
  auVar93._4_4_ = (fVar142 + fVar142) * fVar83;
  auVar93._8_4_ = (fVar11 + fVar11) * fVar84;
  auVar93._12_4_ = (fVar15 + fVar15) * fVar85;
  auVar54 = vsubps_avx(auVar93,auVar110);
  fVar114 = auVar136._0_4_ * auVar136._0_4_;
  fVar119 = auVar136._4_4_ * auVar136._4_4_;
  fVar121 = auVar136._8_4_ * auVar136._8_4_;
  fVar123 = auVar136._12_4_ * auVar136._12_4_;
  auVar56._0_4_ = fVar114 * local_1c8;
  auVar56._4_4_ = fVar119 * fStack_1c4;
  auVar56._8_4_ = fVar121 * fStack_1c0;
  auVar56._12_4_ = fVar123 * fStack_1bc;
  auVar33 = vsubps_avx(_local_158,auVar56);
  auVar94._0_4_ = auVar33._0_4_ * (auVar39._0_4_ + auVar110._0_4_ * auVar54._0_4_);
  auVar94._4_4_ = auVar33._4_4_ * (auVar39._4_4_ + auVar110._4_4_ * auVar54._4_4_);
  auVar94._8_4_ = auVar33._8_4_ * (auVar39._8_4_ + auVar110._8_4_ * auVar54._8_4_);
  auVar94._12_4_ = auVar33._12_4_ * (auVar39._12_4_ + auVar110._12_4_ * auVar54._12_4_);
  auVar111._0_4_ = auVar148._0_4_ * auVar148._0_4_;
  auVar111._4_4_ = auVar148._4_4_ * auVar148._4_4_;
  auVar111._8_4_ = auVar148._8_4_ * auVar148._8_4_;
  auVar111._12_4_ = auVar148._12_4_ * auVar148._12_4_;
  auVar54 = vsubps_avx(auVar111,auVar94);
  auVar55 = ZEXT816(0) << 0x40;
  auVar39 = vcmpps_avx(auVar54,auVar55,5);
  auVar44 = auVar39 & ~auVar36;
  if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar44[0xf] < '\0') {
    auVar44 = vandnps_avx(auVar36,auVar39);
    auVar37 = vsubps_avx(auVar65,auVar37);
    auVar56 = vsubps_avx(auVar152,auVar45);
    auVar92 = vsubps_avx(auVar53,auVar95);
    auVar36 = vsqrtps_avx(auVar54);
    auVar39 = vrcpps_avx(auVar33);
    fVar124 = auVar39._0_4_;
    auVar126._0_4_ = auVar33._0_4_ * fVar124;
    fVar128 = auVar39._4_4_;
    auVar126._4_4_ = auVar33._4_4_ * fVar128;
    fVar130 = auVar39._8_4_;
    auVar126._8_4_ = auVar33._8_4_ * fVar130;
    fVar132 = auVar39._12_4_;
    auVar126._12_4_ = auVar33._12_4_ * fVar132;
    auVar69._8_4_ = 0x3f800000;
    auVar69._0_8_ = &DAT_3f8000003f800000;
    auVar69._12_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar69,auVar126);
    fVar124 = auVar39._0_4_ * fVar124 + fVar124;
    fVar128 = auVar39._4_4_ * fVar128 + fVar128;
    fVar130 = auVar39._8_4_ * fVar130 + fVar130;
    fVar132 = auVar39._12_4_ * fVar132 + fVar132;
    auVar95._8_4_ = 0x7fffffff;
    auVar95._0_8_ = 0x7fffffff7fffffff;
    auVar95._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx(auVar33,auVar95);
    auVar96._8_4_ = 0x219392ef;
    auVar96._0_8_ = 0x219392ef219392ef;
    auVar96._12_4_ = 0x219392ef;
    auVar39 = vcmpps_avx(auVar39,auVar96,2);
    uVar27 = CONCAT44(auVar148._4_4_,auVar148._0_4_);
    auVar97._0_8_ = uVar27 ^ 0x8000000080000000;
    auVar97._8_4_ = -auVar148._8_4_;
    auVar97._12_4_ = -auVar148._12_4_;
    auVar45 = vsubps_avx(auVar97,auVar36);
    auVar36 = vsubps_avx(auVar36,auVar148);
    auVar98._0_4_ = fVar124 * auVar45._0_4_;
    auVar98._4_4_ = fVar128 * auVar45._4_4_;
    auVar98._8_4_ = fVar130 * auVar45._8_4_;
    auVar98._12_4_ = fVar132 * auVar45._12_4_;
    auVar115._0_4_ = auVar36._0_4_ * fVar124;
    auVar115._4_4_ = auVar36._4_4_ * fVar128;
    auVar115._8_4_ = auVar36._8_4_ * fVar130;
    auVar115._12_4_ = auVar36._12_4_ * fVar132;
    auVar34._8_4_ = 0xff800000;
    auVar34._0_8_ = 0xff800000ff800000;
    auVar34._12_4_ = 0xff800000;
    auVar36 = vblendvps_avx(auVar98,auVar34,auVar39);
    auVar127._8_4_ = 0x7f800000;
    auVar127._0_8_ = 0x7f8000007f800000;
    auVar127._12_4_ = 0x7f800000;
    auVar45 = vblendvps_avx(auVar115,auVar127,auVar39);
    auVar35._0_4_ = auVar136._0_4_ * auVar36._0_4_ + fVar80;
    auVar35._4_4_ = auVar136._4_4_ * auVar36._4_4_ + fVar83;
    auVar35._8_4_ = auVar136._8_4_ * auVar36._8_4_ + fVar84;
    auVar35._12_4_ = auVar136._12_4_ * auVar36._12_4_ + fVar85;
    auVar39 = vcmpps_avx(auVar35,auVar55,6);
    auVar24._4_4_ = fVar40;
    auVar24._0_4_ = fVar32;
    auVar24._8_4_ = fVar41;
    auVar24._12_4_ = fVar42;
    auVar95 = vcmpps_avx(auVar35,auVar24,1);
    auVar39 = vandps_avx(auVar39,auVar95);
    auVar39 = vandps_avx(auVar44,auVar39);
    auVar95 = vblendvps_avx(auVar127,auVar36,auVar39);
    local_268._0_4_ = fVar80 + auVar136._0_4_ * auVar45._0_4_;
    local_268._4_4_ = fVar83 + auVar136._4_4_ * auVar45._4_4_;
    fStack_260 = fVar84 + auVar136._8_4_ * auVar45._8_4_;
    fStack_25c = fVar85 + auVar136._12_4_ * auVar45._12_4_;
    auVar39 = vcmpps_avx(_local_268,auVar55,6);
    auVar36 = vcmpps_avx(_local_268,auVar24,1);
    auVar39 = vandps_avx(auVar36,auVar39);
    auVar39 = vandps_avx(auVar44,auVar39);
    local_258 = vblendvps_avx(auVar34,auVar45,auVar39);
    auVar39 = vrcpps_avx(auVar136);
    fVar124 = auVar39._0_4_;
    auVar99._0_4_ = auVar136._0_4_ * fVar124;
    fVar128 = auVar39._4_4_;
    auVar99._4_4_ = auVar136._4_4_ * fVar128;
    fVar130 = auVar39._8_4_;
    auVar99._8_4_ = auVar136._8_4_ * fVar130;
    fVar132 = auVar39._12_4_;
    auVar99._12_4_ = auVar136._12_4_ * fVar132;
    auVar39 = vsubps_avx(auVar69,auVar99);
    fVar124 = fVar124 + fVar124 * auVar39._0_4_;
    fVar128 = fVar128 + fVar128 * auVar39._4_4_;
    fVar130 = fVar130 + fVar130 * auVar39._8_4_;
    fVar132 = fVar132 + fVar132 * auVar39._12_4_;
    auVar86._0_4_ = auVar136._0_4_ * fVar113;
    auVar86._4_4_ = auVar136._4_4_ * fVar118;
    auVar86._8_4_ = auVar136._8_4_ * fVar120;
    auVar86._12_4_ = auVar136._12_4_ * fVar122;
    auVar100._0_4_ = fVar135 * fVar80;
    auVar100._4_4_ = fVar135 * fVar83;
    auVar100._8_4_ = fVar135 * fVar84;
    auVar100._12_4_ = fVar135 * fVar85;
    auVar39 = vsubps_avx(auVar86,auVar100);
    auVar101._0_4_ = auVar136._0_4_ * fVar147;
    auVar101._4_4_ = auVar136._4_4_ * fVar149;
    auVar101._8_4_ = auVar136._8_4_ * fVar150;
    auVar101._12_4_ = auVar136._12_4_ * fVar151;
    auVar153._0_4_ = fVar140 * fVar80;
    auVar153._4_4_ = fVar140 * fVar83;
    auVar153._8_4_ = fVar140 * fVar84;
    auVar153._12_4_ = fVar140 * fVar85;
    auVar36 = vsubps_avx(auVar101,auVar153);
    auVar154._0_4_ = auVar136._0_4_ * fVar43;
    auVar154._4_4_ = auVar136._4_4_ * fVar144;
    auVar154._8_4_ = auVar136._8_4_ * fVar145;
    auVar154._12_4_ = auVar136._12_4_ * fVar146;
    auVar70._0_4_ = fVar125 * fVar80;
    auVar70._4_4_ = fVar125 * fVar83;
    auVar70._8_4_ = fVar125 * fVar84;
    auVar70._12_4_ = fVar125 * fVar85;
    auVar45 = vsubps_avx(auVar154,auVar70);
    auVar71._0_4_ =
         auVar39._0_4_ * auVar39._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar45._0_4_ * auVar45._0_4_;
    auVar71._4_4_ =
         auVar39._4_4_ * auVar39._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar45._4_4_ * auVar45._4_4_;
    auVar71._8_4_ =
         auVar39._8_4_ * auVar39._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar45._8_4_ * auVar45._8_4_;
    auVar71._12_4_ =
         auVar39._12_4_ * auVar39._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar45._12_4_ * auVar45._12_4_;
    auVar87._0_4_ = fVar134 * fVar134 * fVar114;
    auVar87._4_4_ = fVar137 * fVar137 * fVar119;
    auVar87._8_4_ = fVar138 * fVar138 * fVar121;
    auVar87._12_4_ = fVar139 * fVar139 * fVar123;
    auVar39 = vcmpps_avx(auVar71,auVar87,1);
    auVar88._0_4_ = fVar124 * -fVar80;
    auVar88._4_4_ = fVar128 * -fVar83;
    auVar88._8_4_ = fVar130 * -fVar84;
    auVar88._12_4_ = fVar132 * -fVar85;
    auVar36 = vblendvps_avx(auVar127,auVar88,auVar39);
    local_328._0_4_ = auVar37._0_4_;
    local_328._4_4_ = auVar37._4_4_;
    fStack_320 = auVar37._8_4_;
    fStack_31c = auVar37._12_4_;
    fVar80 = (float)local_328._0_4_ * fVar133 + auVar56._0_4_ * fVar131 + auVar92._0_4_ * fVar129;
    fVar83 = (float)local_328._4_4_ * fVar141 + auVar56._4_4_ * fVar51 + auVar92._4_4_ * fVar50;
    fVar84 = fStack_320 * fVar10 + auVar56._8_4_ * fVar9 + auVar92._8_4_ * fVar143;
    fVar85 = fStack_31c * fVar14 + auVar56._12_4_ * fVar13 + auVar92._12_4_ * fVar12;
    auVar39 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar44);
    local_2a8 = vblendvps_avx(auVar127,auVar36,auVar39);
    auVar36._0_4_ = auVar136._0_4_ * (float)local_328._0_4_;
    auVar36._4_4_ = auVar136._4_4_ * (float)local_328._4_4_;
    auVar36._8_4_ = auVar136._8_4_ * fStack_320;
    auVar36._12_4_ = auVar136._12_4_ * fStack_31c;
    auVar66._0_4_ = auVar136._0_4_ * auVar56._0_4_;
    auVar66._4_4_ = auVar136._4_4_ * auVar56._4_4_;
    auVar66._8_4_ = auVar136._8_4_ * auVar56._8_4_;
    auVar66._12_4_ = auVar136._12_4_ * auVar56._12_4_;
    auVar45._0_4_ = auVar136._0_4_ * auVar92._0_4_;
    auVar45._4_4_ = auVar136._4_4_ * auVar92._4_4_;
    auVar45._8_4_ = auVar136._8_4_ * auVar92._8_4_;
    auVar45._12_4_ = auVar136._12_4_ * auVar92._12_4_;
    auVar72._0_4_ = fVar135 * fVar80;
    auVar72._4_4_ = fVar135 * fVar83;
    auVar72._8_4_ = fVar135 * fVar84;
    auVar72._12_4_ = fVar135 * fVar85;
    auVar39 = vsubps_avx(auVar36,auVar72);
    auVar73._0_4_ = fVar140 * fVar80;
    auVar73._4_4_ = fVar140 * fVar83;
    auVar73._8_4_ = fVar140 * fVar84;
    auVar73._12_4_ = fVar140 * fVar85;
    auVar36 = vsubps_avx(auVar66,auVar73);
    auVar74._0_4_ = fVar125 * fVar80;
    auVar74._4_4_ = fVar125 * fVar83;
    auVar74._8_4_ = fVar125 * fVar84;
    auVar74._12_4_ = fVar125 * fVar85;
    auVar45 = vsubps_avx(auVar45,auVar74);
    auVar37._0_4_ =
         auVar39._0_4_ * auVar39._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar45._0_4_ * auVar45._0_4_;
    auVar37._4_4_ =
         auVar39._4_4_ * auVar39._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar45._4_4_ * auVar45._4_4_;
    auVar37._8_4_ =
         auVar39._8_4_ * auVar39._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar45._8_4_ * auVar45._8_4_;
    auVar37._12_4_ =
         auVar39._12_4_ * auVar39._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar45._12_4_ * auVar45._12_4_;
    auVar39 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar44);
    local_2b8._0_4_ = auVar46._0_4_;
    local_2b8._4_4_ = auVar46._4_4_;
    fStack_2b0 = auVar46._8_4_;
    fStack_2ac = auVar46._12_4_;
    auVar67._0_4_ = (float)local_2b8._0_4_ * (float)local_2b8._0_4_ * fVar114;
    auVar67._4_4_ = (float)local_2b8._4_4_ * (float)local_2b8._4_4_ * fVar119;
    auVar67._8_4_ = fStack_2b0 * fStack_2b0 * fVar121;
    auVar67._12_4_ = fStack_2ac * fStack_2ac * fVar123;
    auVar36 = vcmpps_avx(auVar37,auVar67,1);
    auVar57._0_4_ = fVar124 * -fVar80;
    auVar57._4_4_ = fVar128 * -fVar83;
    auVar57._8_4_ = fVar130 * -fVar84;
    auVar57._12_4_ = fVar132 * -fVar85;
    auVar36 = vblendvps_avx(auVar127,auVar57,auVar36);
    auVar39 = vblendvps_avx(auVar127,auVar36,auVar39);
    auVar46 = vminps_avx(local_2a8,auVar39);
    auVar36 = vmaxps_avx(local_2a8,auVar39);
    auVar37 = vminps_avx(auVar95,auVar46);
    auVar45 = vcmpps_avx(auVar37,auVar46,0);
    auVar39 = vcmpps_avx(auVar127,auVar36,0);
    auVar102._8_4_ = 0xff800000;
    auVar102._0_8_ = 0xff800000ff800000;
    auVar102._12_4_ = 0xff800000;
    auVar39 = vblendvps_avx(auVar36,auVar102,auVar39);
    auVar36 = vcmpps_avx(auVar127,auVar46,0);
    auVar36 = vblendvps_avx(auVar46,auVar102,auVar36);
    auVar39 = vblendvps_avx(auVar36,auVar39,auVar45);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar58._4_4_ = uVar1;
    auVar58._0_4_ = uVar1;
    auVar58._8_4_ = uVar1;
    auVar58._12_4_ = uVar1;
    local_48 = vmaxps_avx(local_258,auVar39);
    auVar46._0_4_ = local_238 + auVar37._0_4_;
    auVar46._4_4_ = fStack_234 + auVar37._4_4_;
    auVar46._8_4_ = fStack_230 + auVar37._8_4_;
    auVar46._12_4_ = fStack_22c + auVar37._12_4_;
    auVar39 = vcmpps_avx(auVar58,auVar46,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar75._4_4_ = uVar1;
    auVar75._0_4_ = uVar1;
    auVar75._8_4_ = uVar1;
    auVar75._12_4_ = uVar1;
    auVar36 = vcmpps_avx(auVar46,auVar75,2);
    auVar39 = vandps_avx(auVar39,auVar36);
    auVar36 = vcmpps_avx(auVar127,auVar37,4);
    local_2c8 = vandps_avx(auVar39,auVar36);
    auVar39 = vandps_avx(auVar44,local_2c8);
    local_328._0_4_ = local_238 + local_48._0_4_;
    local_328._4_4_ = fStack_234 + local_48._4_4_;
    fStack_320 = fStack_230 + local_48._8_4_;
    fStack_31c = fStack_22c + local_48._12_4_;
    auVar36 = vcmpps_avx(auVar58,_local_328,2);
    auVar45 = vcmpps_avx(_local_328,auVar75,2);
    auVar36 = vandps_avx(auVar36,auVar45);
    auVar45 = vcmpps_avx(local_48,auVar102,4);
    auVar45 = vandps_avx(auVar44,auVar45);
    local_2d8 = vandps_avx(auVar36,auVar45);
    auVar36 = vorps_avx(auVar39,local_2d8);
    uVar26 = vmovmskps_avx(auVar36);
    if (uVar26 != 0) {
      auVar45 = vblendvps_avx(local_48,auVar37,auVar39);
      auVar46 = vblendvps_avx(_local_268,auVar35,auVar39);
      auVar25._4_4_ = fVar40;
      auVar25._0_4_ = fVar32;
      auVar25._8_4_ = fVar41;
      auVar25._12_4_ = fVar42;
      auVar39 = vrcpps_avx(auVar25);
      local_318 = auVar39._0_4_;
      auVar68._0_4_ = fVar32 * local_318;
      fStack_314 = auVar39._4_4_;
      auVar68._4_4_ = fVar40 * fStack_314;
      fStack_310 = auVar39._8_4_;
      auVar68._8_4_ = fVar41 * fStack_310;
      fStack_30c = auVar39._12_4_;
      auVar68._12_4_ = fVar42 * fStack_30c;
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = &DAT_3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar116,auVar68);
      local_318 = local_318 + local_318 * auVar39._0_4_;
      fStack_314 = fStack_314 + fStack_314 * auVar39._4_4_;
      fStack_310 = fStack_310 + fStack_310 * auVar39._8_4_;
      fStack_30c = fStack_30c + fStack_30c * auVar39._12_4_;
      fVar134 = fVar32 * fVar49 * fVar134;
      fVar137 = fVar40 * fVar142 * fVar137;
      fVar138 = fVar41 * fVar11 * fVar138;
      fVar139 = fVar42 * fVar15 * fVar139;
      local_248 = fVar131 * local_1c8;
      fStack_244 = fVar51 * fStack_1c4;
      fStack_240 = fVar9 * fStack_1c0;
      fStack_23c = fVar13 * fStack_1bc;
      auVar39 = vcmpps_avx(auVar45,auVar95,0);
      auVar36 = vcmpps_avx(auVar45,local_258,0);
      auVar39 = vorps_avx(auVar39,auVar36);
      auVar39 = vandps_avx(auVar44,auVar39);
      auVar36 = vcmpps_avx(auVar45,local_2a8,0);
      auVar36 = vandps_avx(auVar44,auVar36);
      fVar49 = auVar45._0_4_;
      fVar142 = auVar45._4_4_;
      fVar11 = auVar45._8_4_;
      fVar15 = auVar45._12_4_;
      fStack_1d4 = fVar141 * fVar137;
      local_1d8 = fVar133 * fVar134;
      fStack_1d0 = fVar10 * fVar138;
      fStack_1cc = fVar14 * fVar139;
      auVar59._0_4_ = fVar133 * fVar134 + (float)local_158._0_4_ * (fVar135 * fVar49 + fVar113);
      auVar59._4_4_ = fVar141 * fVar137 + (float)local_158._4_4_ * (fVar135 * fVar142 + fVar118);
      auVar59._8_4_ = fVar10 * fVar138 + fStack_150 * (fVar135 * fVar11 + fVar120);
      auVar59._12_4_ = fVar14 * fVar139 + fStack_14c * (fVar135 * fVar15 + fVar122);
      local_68 = fVar133 * local_1c8;
      fStack_64 = fVar141 * fStack_1c4;
      fStack_60 = fVar10 * fStack_1c0;
      fStack_5c = fVar14 * fStack_1bc;
      local_348._0_4_ = auVar46._0_4_;
      local_348._4_4_ = auVar46._4_4_;
      fStack_340 = auVar46._8_4_;
      fStack_33c = auVar46._12_4_;
      auVar76._0_4_ = fVar133 * local_1c8 * (float)local_348._0_4_;
      auVar76._4_4_ = fVar141 * fStack_1c4 * (float)local_348._4_4_;
      auVar76._8_4_ = fVar10 * fStack_1c0 * fStack_340;
      auVar76._12_4_ = fVar14 * fStack_1bc * fStack_33c;
      auVar46 = vsubps_avx(auVar59,auVar76);
      local_58 = fVar131 * fVar134;
      fStack_54 = fVar51 * fVar137;
      fStack_50 = fVar9 * fVar138;
      fStack_4c = fVar13 * fVar139;
      auVar77._0_4_ = fVar131 * fVar134 + (float)local_158._0_4_ * (fVar49 * fVar140 + fVar147);
      auVar77._4_4_ = fVar51 * fVar137 + (float)local_158._4_4_ * (fVar142 * fVar140 + fVar149);
      auVar77._8_4_ = fVar9 * fVar138 + fStack_150 * (fVar11 * fVar140 + fVar150);
      auVar77._12_4_ = fVar13 * fVar139 + fStack_14c * (fVar15 * fVar140 + fVar151);
      auVar103._0_4_ = local_248 * (float)local_348._0_4_;
      auVar103._4_4_ = fStack_244 * (float)local_348._4_4_;
      auVar103._8_4_ = fStack_240 * fStack_340;
      auVar103._12_4_ = fStack_23c * fStack_33c;
      auVar37 = vsubps_avx(auVar77,auVar103);
      local_88._0_8_ = local_1e8._0_8_ ^ 0x8000000080000000;
      local_88._8_4_ = -fVar10;
      local_88._12_4_ = -fVar14;
      auVar45 = vblendvps_avx(local_1e8,local_88,auVar36);
      local_188 = vblendvps_avx(auVar45,auVar46,auVar39);
      auVar112 = ZEXT1664(local_208);
      local_1c8 = fVar129 * local_1c8;
      fStack_1c4 = fVar50 * fStack_1c4;
      fStack_1c0 = fVar143 * fStack_1c0;
      fStack_1bc = fVar12 * fStack_1bc;
      local_78 = fVar129 * fVar134;
      fStack_74 = fVar50 * fVar137;
      fStack_70 = fVar143 * fVar138;
      fStack_6c = fVar12 * fVar139;
      auVar89._0_4_ = fVar129 * fVar134 + (float)local_158._0_4_ * (fVar43 + fVar49 * fVar125);
      auVar89._4_4_ = fVar50 * fVar137 + (float)local_158._4_4_ * (fVar144 + fVar142 * fVar125);
      auVar89._8_4_ = fVar143 * fVar138 + fStack_150 * (fVar145 + fVar11 * fVar125);
      auVar89._12_4_ = fVar12 * fVar139 + fStack_14c * (fVar146 + fVar15 * fVar125);
      auVar155 = ZEXT1664(local_1e8);
      auVar104._0_4_ = local_1c8 * (float)local_348._0_4_;
      auVar104._4_4_ = fStack_1c4 * (float)local_348._4_4_;
      auVar104._8_4_ = fStack_1c0 * fStack_340;
      auVar104._12_4_ = fStack_1bc * fStack_33c;
      local_98._0_8_ = local_1f8._0_8_ ^ 0x8000000080000000;
      local_98._8_4_ = -fVar9;
      local_98._12_4_ = -fVar13;
      auVar45 = vblendvps_avx(local_1f8,local_98,auVar36);
      auVar46 = vsubps_avx(auVar89,auVar104);
      local_178 = vblendvps_avx(auVar45,auVar37,auVar39);
      local_a8._0_8_ = local_208._0_8_ ^ 0x8000000080000000;
      local_a8._8_4_ = -fVar143;
      local_a8._12_4_ = -fVar12;
      auVar45 = vblendvps_avx(local_208,local_a8,auVar36);
      local_168 = vblendvps_avx(auVar45,auVar46,auVar39);
      auVar47._8_4_ = 0x3f800000;
      auVar47._0_8_ = &DAT_3f8000003f800000;
      auVar47._12_4_ = 0x3f800000;
      auVar36 = vandnps_avx(auVar36,auVar47);
      auVar48._0_4_ = (float)local_348._0_4_ * local_318;
      auVar48._4_4_ = (float)local_348._4_4_ * fStack_314;
      auVar48._8_4_ = fStack_340 * fStack_310;
      auVar48._12_4_ = fStack_33c * fStack_30c;
      local_1b8 = vblendvps_avx(auVar36,auVar48,auVar39);
      local_198._0_4_ = fVar49 + local_238;
      local_198._4_4_ = fVar142 + fStack_234;
      local_198._8_4_ = fVar11 + fStack_230;
      local_198._12_4_ = fVar15 + fStack_22c;
      local_1a8 = ZEXT816(0) << 0x20;
      uVar27 = (ulong)(uVar26 & 0xff);
      lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar108 = ZEXT1664(local_1f8);
      auVar117 = ZEXT1664(local_288);
      auVar62 = ZEXT1664(_local_328);
      fVar129 = fVar125;
      fVar131 = fVar125;
      fVar133 = fVar125;
      fVar49 = fVar135;
      fVar50 = fVar135;
      fVar51 = fVar135;
      fVar141 = fVar140;
      fVar142 = fVar140;
      fVar143 = fVar140;
      fStack_350 = fVar140;
      fStack_34c = fVar140;
      _local_348 = auVar36;
      local_338 = fVar125;
      fStack_334 = fVar125;
      fStack_330 = fVar125;
      fStack_32c = fVar125;
      _local_2b8 = auVar95;
      local_228 = fVar135;
      fStack_224 = fVar135;
      fStack_220 = fVar135;
      fStack_21c = fVar135;
      local_358._0_4_ = fVar140;
      local_358._4_4_ = fVar140;
      do {
        local_308.hit = local_138;
        local_308.valid = (int *)&local_368;
        uVar8 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar26 = *(uint *)(local_148 + uVar8 * 4);
        pGVar6 = (pSVar28->geometries).items[uVar26].ptr;
        local_308.ray = (RTCRayN *)ray;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar27 = uVar27 ^ 1L << (uVar8 & 0x3f);
          bVar30 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar30 = false;
        }
        else {
          local_238 = *(float *)(ray + k * 4 + 0x80);
          local_108._4_4_ = *(undefined4 *)(local_1b8 + uVar8 * 4);
          local_f8._4_4_ = *(undefined4 *)(local_1a8 + uVar8 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + uVar8 * 4);
          local_308.context = context->user;
          local_d8 = vpshufd_avx(ZEXT416(uVar26),0);
          uVar26 = (line->primIDs).field_0.i[uVar8];
          local_e8._4_4_ = uVar26;
          local_e8._0_4_ = uVar26;
          local_e8._8_4_ = uVar26;
          local_e8._12_4_ = uVar26;
          uVar1 = *(undefined4 *)(local_188 + uVar8 * 4);
          uVar2 = *(undefined4 *)(local_178 + uVar8 * 4);
          local_128._4_4_ = uVar2;
          local_128._0_4_ = uVar2;
          local_128._8_4_ = uVar2;
          local_128._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_168 + uVar8 * 4);
          local_118._4_4_ = uVar2;
          local_118._0_4_ = uVar2;
          local_118._8_4_ = uVar2;
          local_118._12_4_ = uVar2;
          local_138[0] = (RTCHitN)(char)uVar1;
          local_138[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_138[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_138[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_138[4] = (RTCHitN)(char)uVar1;
          local_138[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_138[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_138[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_138[8] = (RTCHitN)(char)uVar1;
          local_138[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_138[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_138[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_138[0xc] = (RTCHitN)(char)uVar1;
          local_138[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_138[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_138[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_108._0_4_ = local_108._4_4_;
          local_108._8_4_ = local_108._4_4_;
          local_108._12_4_ = local_108._4_4_;
          local_f8._0_4_ = local_f8._4_4_;
          local_f8._8_4_ = local_f8._4_4_;
          local_f8._12_4_ = local_f8._4_4_;
          vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
          uStack_c4 = (local_308.context)->instID[0];
          local_c8 = uStack_c4;
          uStack_c0 = uStack_c4;
          uStack_bc = uStack_c4;
          uStack_b8 = (local_308.context)->instPrimID[0];
          uStack_b4 = uStack_b8;
          uStack_b0 = uStack_b8;
          uStack_ac = uStack_b8;
          local_368 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
          uStack_360 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
          local_308.geometryUserPtr = pGVar6->userPtr;
          local_308.N = 4;
          local_270 = pSVar28;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)(&local_308);
            auVar155 = ZEXT1664(local_1e8);
            auVar117 = ZEXT1664(local_288);
            auVar112 = ZEXT1664(local_208);
            auVar108 = ZEXT1664(local_1f8);
            fVar125 = local_338;
            fVar129 = fStack_334;
            fVar131 = fStack_330;
            fVar133 = fStack_32c;
            fVar135 = local_228;
            fVar49 = fStack_224;
            fVar50 = fStack_220;
            fVar51 = fStack_21c;
            fVar140 = (float)local_358;
            fVar141 = local_358._4_4_;
            fVar142 = fStack_350;
            fVar143 = fStack_34c;
            fVar43 = (float)local_218._0_4_;
            fVar144 = (float)local_218._4_4_;
            fVar145 = fStack_210;
            fVar146 = fStack_20c;
            fVar113 = (float)local_298._0_4_;
            fVar118 = (float)local_298._4_4_;
            fVar120 = fStack_290;
            fVar122 = fStack_28c;
          }
          auVar20._8_8_ = uStack_360;
          auVar20._0_8_ = local_368;
          if (auVar20 == (undefined1  [16])0x0) {
            auVar36 = ZEXT816(0) << 0x40;
            auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,auVar36);
            auVar36 = vpcmpeqd_avx(auVar36,auVar36);
            auVar39 = auVar39 ^ auVar36;
          }
          else {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&local_308);
              auVar155 = ZEXT1664(local_1e8);
              auVar117 = ZEXT1664(local_288);
              auVar112 = ZEXT1664(local_208);
              auVar108 = ZEXT1664(local_1f8);
              fVar125 = local_338;
              fVar129 = fStack_334;
              fVar131 = fStack_330;
              fVar133 = fStack_32c;
              fVar135 = local_228;
              fVar49 = fStack_224;
              fVar50 = fStack_220;
              fVar51 = fStack_21c;
              fVar140 = (float)local_358;
              fVar141 = local_358._4_4_;
              fVar142 = fStack_350;
              fVar143 = fStack_34c;
              fVar43 = (float)local_218._0_4_;
              fVar144 = (float)local_218._4_4_;
              fVar145 = fStack_210;
              fVar146 = fStack_20c;
              fVar113 = (float)local_298._0_4_;
              fVar118 = (float)local_298._4_4_;
              fVar120 = fStack_290;
              fVar122 = fStack_28c;
            }
            auVar21._8_8_ = uStack_360;
            auVar21._0_8_ = local_368;
            auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,auVar21);
            auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar39 = auVar36 ^ auVar39;
            auVar60._8_4_ = 0xff800000;
            auVar60._0_8_ = 0xff800000ff800000;
            auVar60._12_4_ = 0xff800000;
            auVar36 = vblendvps_avx(auVar60,*(undefined1 (*) [16])(local_308.ray + 0x80),auVar36);
            *(undefined1 (*) [16])(local_308.ray + 0x80) = auVar36;
          }
          auVar39 = vpslld_avx(auVar39,0x1f);
          bVar17 = (auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar18 = (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar16 = (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar31 = -1 < auVar39[0xf];
          bVar30 = ((bVar17 && bVar18) && bVar16) && bVar31;
          auVar62 = ZEXT1664(_local_328);
          pSVar28 = local_270;
          if (((bVar17 && bVar18) && bVar16) && bVar31) {
            *(float *)(ray + k * 4 + 0x80) = local_238;
            uVar27 = uVar27 ^ 1L << (uVar8 & 0x3f);
          }
        }
      } while ((bVar30 != false) && (uVar27 != 0));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar38._4_4_ = uVar1;
      auVar38._0_4_ = uVar1;
      auVar38._8_4_ = uVar1;
      auVar38._12_4_ = uVar1;
      auVar36 = vcmpps_avx(auVar62._0_16_,auVar38,2);
      auVar39 = vandps_avx(local_2d8,local_2c8);
      auVar39 = vandps_avx(auVar39,auVar36);
      uVar26 = vmovmskps_avx(auVar39);
      if (uVar26 == 0) {
        return (bool)(bVar30 ^ 1U);
      }
      auVar45 = vcmpps_avx(local_48,local_2a8,0);
      auVar39 = vblendvps_avx(auVar155._0_16_,local_88,auVar45);
      auVar36 = vblendvps_avx(auVar108._0_16_,local_98,auVar45);
      auVar45 = vblendvps_avx(auVar112._0_16_,local_a8,auVar45);
      auVar46 = vcmpps_avx(local_48,_local_2b8,0);
      auVar95 = vcmpps_avx(local_48,local_258,0);
      auVar46 = vorps_avx(auVar46,auVar95);
      fVar9 = local_48._0_4_;
      fVar10 = local_48._4_4_;
      fVar11 = local_48._8_4_;
      fVar12 = local_48._12_4_;
      auVar78._0_4_ = (float)local_158._0_4_ * (fVar113 + fVar135 * fVar9) + local_1d8;
      auVar78._4_4_ = (float)local_158._4_4_ * (fVar118 + fVar49 * fVar10) + fStack_1d4;
      auVar78._8_4_ = fStack_150 * (fVar120 + fVar50 * fVar11) + fStack_1d0;
      auVar78._12_4_ = fStack_14c * (fVar122 + fVar51 * fVar12) + fStack_1cc;
      auVar82._0_4_ = (float)local_158._0_4_ * (auVar117._0_4_ + fVar140 * fVar9) + local_58;
      auVar82._4_4_ = (float)local_158._4_4_ * (auVar117._4_4_ + fVar141 * fVar10) + fStack_54;
      auVar82._8_4_ = fStack_150 * (auVar117._8_4_ + fVar142 * fVar11) + fStack_50;
      auVar82._12_4_ = fStack_14c * (auVar117._12_4_ + fVar143 * fVar12) + fStack_4c;
      auVar90._0_4_ = (float)local_158._0_4_ * (fVar43 + fVar125 * fVar9) + local_78;
      auVar90._4_4_ = (float)local_158._4_4_ * (fVar144 + fVar129 * fVar10) + fStack_74;
      auVar90._8_4_ = fStack_150 * (fVar145 + fVar131 * fVar11) + fStack_70;
      auVar90._12_4_ = fStack_14c * (fVar146 + fVar133 * fVar12) + fStack_6c;
      auVar105._0_4_ = (float)local_268._0_4_ * local_68;
      auVar105._4_4_ = (float)local_268._4_4_ * fStack_64;
      auVar105._8_4_ = fStack_260 * fStack_60;
      auVar105._12_4_ = fStack_25c * fStack_5c;
      auVar95 = vsubps_avx(auVar78,auVar105);
      auVar106._0_4_ = (float)local_268._0_4_ * local_248;
      auVar106._4_4_ = (float)local_268._4_4_ * fStack_244;
      auVar106._8_4_ = fStack_260 * fStack_240;
      auVar106._12_4_ = fStack_25c * fStack_23c;
      auVar37 = vsubps_avx(auVar82,auVar106);
      auVar107._0_4_ = (float)local_268._0_4_ * local_1c8;
      auVar107._4_4_ = (float)local_268._4_4_ * fStack_1c4;
      auVar107._8_4_ = fStack_260 * fStack_1c0;
      auVar107._12_4_ = fStack_25c * fStack_1bc;
      auVar54 = vsubps_avx(auVar90,auVar107);
      local_188 = vblendvps_avx(auVar39,auVar95,auVar46);
      local_178 = vblendvps_avx(auVar36,auVar37,auVar46);
      local_168 = vblendvps_avx(auVar45,auVar54,auVar46);
      auVar79._0_4_ = (float)local_268._0_4_ * local_318;
      auVar79._4_4_ = (float)local_268._4_4_ * fStack_314;
      auVar79._8_4_ = fStack_260 * fStack_310;
      auVar79._12_4_ = fStack_25c * fStack_30c;
      local_1b8 = vblendvps_avx(_local_348,auVar79,auVar46);
      auVar108 = ZEXT464(0) << 0x20;
      local_1a8 = ZEXT416(0) << 0x20;
      local_198 = auVar62._0_16_;
      local_358 = context->scene;
      lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      uVar27 = (ulong)(uVar26 & 0xff);
      auVar62 = ZEXT864(0) << 0x20;
      auVar39 = vpcmpeqd_avx(auVar117._0_16_,auVar117._0_16_);
      auVar112 = ZEXT1664(auVar39);
      local_278 = line;
      do {
        local_308.hit = local_138;
        local_308.valid = (int *)&local_368;
        uVar8 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar26 = *(uint *)(local_148 + uVar8 * 4);
        pGVar6 = (local_358->geometries).items[uVar26].ptr;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar27 = uVar27 ^ 1L << (uVar8 & 0x3f);
          bVar31 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar31 = false;
        }
        else {
          local_338 = *(float *)(ray + k * 4 + 0x80);
          uVar1 = *(undefined4 *)(local_1b8 + uVar8 * 4);
          local_108._4_4_ = uVar1;
          local_108._0_4_ = uVar1;
          local_108._8_4_ = uVar1;
          local_108._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_1a8 + uVar8 * 4);
          local_f8._4_4_ = uVar1;
          local_f8._0_4_ = uVar1;
          local_f8._8_4_ = uVar1;
          local_f8._12_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + uVar8 * 4);
          local_308.context = context->user;
          local_d8 = vpshufd_avx(ZEXT416(uVar26),0);
          uVar26 = (local_278->primIDs).field_0.i[uVar8];
          local_e8._4_4_ = uVar26;
          local_e8._0_4_ = uVar26;
          local_e8._8_4_ = uVar26;
          local_e8._12_4_ = uVar26;
          uVar1 = *(undefined4 *)(local_188 + uVar8 * 4);
          uVar2 = *(undefined4 *)(local_178 + uVar8 * 4);
          local_128._4_4_ = uVar2;
          local_128._0_4_ = uVar2;
          local_128._8_4_ = uVar2;
          local_128._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_168 + uVar8 * 4);
          local_118._4_4_ = uVar2;
          local_118._0_4_ = uVar2;
          local_118._8_4_ = uVar2;
          local_118._12_4_ = uVar2;
          local_138[0] = (RTCHitN)(char)uVar1;
          local_138[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_138[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_138[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_138[4] = (RTCHitN)(char)uVar1;
          local_138[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_138[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_138[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_138[8] = (RTCHitN)(char)uVar1;
          local_138[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_138[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_138[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_138[0xc] = (RTCHitN)(char)uVar1;
          local_138[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_138[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_138[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          vcmpps_avx(auVar62._0_32_,auVar62._0_32_,0xf);
          uStack_c4 = (local_308.context)->instID[0];
          local_c8 = uStack_c4;
          uStack_c0 = uStack_c4;
          uStack_bc = uStack_c4;
          uStack_b8 = (local_308.context)->instPrimID[0];
          uStack_b4 = uStack_b8;
          uStack_b0 = uStack_b8;
          uStack_ac = uStack_b8;
          local_368 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
          uStack_360 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
          local_308.geometryUserPtr = pGVar6->userPtr;
          local_308.N = 4;
          local_308.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar39 = auVar112._0_16_;
            (*pGVar6->occlusionFilterN)(&local_308);
            auVar39 = vpcmpeqd_avx(auVar39,auVar39);
            auVar112 = ZEXT1664(auVar39);
            auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar108 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar22._8_8_ = uStack_360;
          auVar22._0_8_ = local_368;
          auVar39 = auVar112._0_16_;
          if (auVar22 == (undefined1  [16])0x0) {
            auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,auVar108._0_16_);
            auVar39 = auVar39 ^ auVar36;
          }
          else {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&local_308);
              auVar39 = vpcmpeqd_avx(auVar39,auVar39);
              auVar112 = ZEXT1664(auVar39);
              auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar108 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar23._8_8_ = uStack_360;
            auVar23._0_8_ = local_368;
            auVar36 = vpcmpeqd_avx(auVar108._0_16_,auVar23);
            auVar39 = auVar112._0_16_ ^ auVar36;
            auVar61._8_4_ = 0xff800000;
            auVar61._0_8_ = 0xff800000ff800000;
            auVar61._12_4_ = 0xff800000;
            auVar36 = vblendvps_avx(auVar61,*(undefined1 (*) [16])(local_308.ray + 0x80),auVar36);
            *(undefined1 (*) [16])(local_308.ray + 0x80) = auVar36;
          }
          auVar39 = vpslld_avx(auVar39,0x1f);
          bVar18 = (auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar19 = (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar17 = (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar16 = -1 < auVar39[0xf];
          bVar31 = ((bVar18 && bVar19) && bVar17) && bVar16;
          if (((bVar18 && bVar19) && bVar17) && bVar16) {
            *(float *)(ray + k * 4 + 0x80) = local_338;
            uVar27 = uVar27 ^ 1L << (uVar8 & 0x3f);
          }
        }
      } while ((bVar31 != false) && (uVar27 != 0));
      return (bool)(bVar30 ^ 1U | bVar31 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }